

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfobjs.c
# Opt level: O2

FT_Error sfnt_load_face(FT_Stream stream,TT_Face face,FT_Int face_instance_index,FT_Int num_params,
                       FT_Parameter *params)

{
  FT_String **name;
  FT_String **name_00;
  FT_Long *pFVar1;
  byte bVar2;
  ushort uVar3;
  short sVar4;
  short sVar5;
  FT_UShort FVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  FT_Encoding FVar9;
  long lVar10;
  FT_Incremental_InterfaceRec *pFVar11;
  FT_CharMap pFVar12;
  FT_Memory memory;
  undefined1 auVar13 [12];
  FT_Short FVar14;
  FT_Error FVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  TT_Table pTVar19;
  FT_String *pFVar20;
  ulong uVar21;
  FT_Bitmap_Size *pFVar22;
  FT_UInt *pFVar23;
  FT_UShort *pFVar24;
  TT_Face pTVar25;
  char cVar26;
  void *pvVar27;
  ulong uVar28;
  ulong uVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  uint local_98;
  uint local_94;
  TT_Face local_90;
  uint local_84;
  void *local_80;
  void *local_78;
  FT_Memory local_70;
  FT_CharMapRec cmaprec;
  uint local_40;
  undefined1 auVar35 [16];
  
  uVar18 = 0;
  uVar21 = (ulong)(uint)num_params;
  if (num_params < 1) {
    uVar21 = uVar18;
  }
  local_80 = face->sfnt;
  bVar32 = false;
  bVar33 = false;
  for (; uVar21 * 0x10 != uVar18; uVar18 = uVar18 + 0x10) {
    lVar10 = *(long *)((long)&params->tag + uVar18);
    if (lVar10 == 0x69677066) {
      bVar33 = true;
    }
    else if (lVar10 == 0x69677073) {
      bVar32 = true;
    }
  }
  bVar31 = true;
  bVar30 = true;
  if (((face->root).internal)->incremental_interface == (FT_Incremental_InterfaceRec *)0x0) {
    pTVar19 = tt_face_lookup_table(face,0x676c7966);
    bVar30 = true;
    if (pTVar19 == (TT_Table)0x0) {
      pTVar19 = tt_face_lookup_table(face,0x43464620);
      bVar30 = true;
      if (pTVar19 == (TT_Table)0x0) {
        pTVar19 = tt_face_lookup_table(face,0x43464632);
        bVar30 = pTVar19 != (TT_Table)0x0;
      }
    }
  }
  local_90 = face;
  FVar15 = (*face->goto_table)(face,0x73626978,stream,(FT_ULong *)0x0);
  local_94 = (uint)bVar30;
  if (FVar15 == 0) {
    local_94 = 0;
  }
  if ((local_94 == 0) && (*(code **)((long)local_80 + 0x88) != (code *)0x0)) {
    iVar16 = (**(code **)((long)local_80 + 0x88))(local_90,stream);
    bVar31 = iVar16 != 0;
    if ((FVar15 == 0) || (iVar16 != 0)) goto LAB_0015a2a9;
    bVar31 = false;
    pTVar25 = local_90;
  }
  else {
LAB_0015a2a9:
    pTVar25 = local_90;
    iVar16 = (**(code **)((long)local_80 + 0x30))(local_90,stream);
    if (iVar16 != 0) {
      return iVar16;
    }
    local_98 = 0;
  }
  pvVar27 = local_80;
  if ((ushort)((pTVar25->header).Units_Per_EM + 0xbfff) < 0xc00f) {
    return 8;
  }
  (**(code **)((long)local_80 + 0x48))(pTVar25,stream);
  (**(code **)((long)pvVar27 + 0x40))(pTVar25,stream);
  (**(code **)((long)pvVar27 + 0x60))(pTVar25,stream);
  local_84 = (**(code **)((long)pvVar27 + 0x58))(pTVar25,stream);
  if (bVar31) {
    local_98 = (**(code **)((long)pvVar27 + 0x38))(pTVar25,stream,0);
    if (local_98 == 0) {
      iVar16 = (**(code **)((long)pvVar27 + 0xb8))(pTVar25,stream,0);
      if ((char)iVar16 == -0x72) {
        local_98 = 0x93;
        goto LAB_0015a3ae;
      }
      if (iVar16 != 0) {
        return iVar16;
      }
      local_98 = 0;
    }
    else {
      if ((char)local_98 != -0x72) {
        return local_98;
      }
      if (pTVar25->format_tag == 0x74727565) {
        local_94 = 0;
      }
      else {
        local_98 = 0x8f;
LAB_0015a3ae:
        pFVar11 = ((pTVar25->root).internal)->incremental_interface;
        if (pFVar11 == (FT_Incremental_InterfaceRec *)0x0) {
          return local_98;
        }
        if (pFVar11->funcs->get_glyph_metrics == (FT_Incremental_GetGlyphMetricsFunc)0x0) {
          return local_98;
        }
        (pTVar25->horizontal).number_Of_HMetrics = 0;
      }
    }
    pvVar27 = local_80;
    local_98 = (**(code **)((long)local_80 + 0x38))(pTVar25,stream,1);
    uVar17 = local_98;
    if ((local_98 == 0) &&
       (local_98 = (**(code **)((long)pvVar27 + 0xb8))(pTVar25,stream,1), uVar17 = local_98,
       local_98 == 0)) {
      pTVar25->vertical_info = '\x01';
      uVar17 = 0;
    }
    pvVar27 = local_80;
    pTVar25 = local_90;
    if (uVar17 != 0 && (char)uVar17 != -0x72) {
      return local_98;
    }
    iVar16 = (**(code **)((long)local_80 + 0x50))(local_90,stream);
    if (iVar16 != 0) {
      (pTVar25->os2).version = 0xffff;
    }
  }
  if (*(code **)((long)pvVar27 + 0xc0) != (code *)0x0) {
    (**(code **)((long)pvVar27 + 0xc0))(pTVar25,stream);
  }
  (**(code **)((long)pvVar27 + 0x80))(pTVar25,stream);
  (**(code **)((long)pvVar27 + 0x78))(pTVar25,stream);
  (**(code **)((long)pvVar27 + 0x70))(pTVar25,stream);
  (pTVar25->root).num_glyphs = (ulong)(pTVar25->max_profile).numGlyphs;
  name = &(pTVar25->root).family_name;
  name_00 = &(pTVar25->root).style_name;
  (pTVar25->root).family_name = (FT_String *)0x0;
  (pTVar25->root).style_name = (FT_String *)0x0;
  if (((pTVar25->os2).version == 0xffff) || (((pTVar25->os2).fsSelection & 0x100) == 0)) {
    local_98 = tt_face_get_name(pTVar25,0x15,name);
    if (local_98 != 0) {
      return local_98;
    }
    pFVar20 = *name;
    if (!bVar33 && pFVar20 == (FT_String *)0x0) {
      FVar15 = tt_face_get_name(local_90,0x10,name);
      if (FVar15 != 0) {
        return FVar15;
      }
      pFVar20 = *name;
    }
    pTVar25 = local_90;
    local_98 = 0;
    if ((pFVar20 == (FT_String *)0x0) && (FVar15 = tt_face_get_name(local_90,1,name), FVar15 != 0))
    {
      return FVar15;
    }
    local_98 = 0;
    local_98 = tt_face_get_name(pTVar25,0x16,name_00);
    if (local_98 != 0) {
      return local_98;
    }
    pFVar20 = *name_00;
    uVar17 = 0;
    pTVar25 = local_90;
    if (!bVar32 && pFVar20 == (FT_String *)0x0) {
      FVar15 = tt_face_get_name(local_90,0x11,name_00);
      if (FVar15 != 0) {
        return FVar15;
      }
      pFVar20 = *name_00;
      uVar17 = 0;
      pTVar25 = local_90;
    }
    goto joined_r0x0015a555;
  }
  if (bVar33) {
LAB_0015a55e:
    uVar17 = tt_face_get_name(pTVar25,1,name);
    if (uVar17 != 0) {
      return uVar17;
    }
  }
  else {
    FVar15 = tt_face_get_name(pTVar25,0x10,name);
    if (FVar15 != 0) {
      return FVar15;
    }
    local_98 = 0;
    uVar17 = 0;
    if (*name == (FT_String *)0x0) goto LAB_0015a55e;
  }
  local_98 = uVar17;
  if ((!bVar32) && (local_98 = tt_face_get_name(pTVar25,0x11,name_00), local_98 != 0)) {
    return local_98;
  }
  pFVar20 = *name_00;
  uVar17 = local_98;
joined_r0x0015a555:
  local_98 = uVar17;
  if ((pFVar20 == (FT_String *)0x0) &&
     (local_98 = tt_face_get_name(pTVar25,2,name_00), local_98 != 0)) {
    return local_98;
  }
  uVar21 = (pTVar25->root).face_flags;
  uVar18 = uVar21 | 0x4000;
  if ((pTVar25->sbit_table_type & ~TT_SBIT_TABLE_TYPE_EBLC) != TT_SBIT_TABLE_TYPE_CBLC) {
    uVar18 = uVar21;
  }
  cVar26 = (char)local_94;
  uVar18 = cVar26 == '\x01' | uVar18;
  uVar21 = uVar18 | 0x18;
  if ((local_84 == 0) && ((pTVar25->postscript).FormatType != 0x30000)) {
    uVar21 = uVar18 | 0x218;
  }
  uVar18 = uVar21 | 4;
  if ((pTVar25->postscript).isFixedPitch == 0) {
    uVar18 = uVar21;
  }
  uVar21 = uVar18 | 0x20;
  if (pTVar25->vertical_info == '\0') {
    uVar21 = uVar18;
  }
  uVar18 = uVar21 | 0x40;
  if (pTVar25->kern_avail_bits == 0) {
    uVar18 = uVar21;
  }
  if ((pTVar25->variation_support & 1) != 0) {
    pTVar19 = tt_face_lookup_table(pTVar25,0x676c7966);
    if (pTVar19 != (TT_Table)0x0) {
      pTVar19 = tt_face_lookup_table(pTVar25,0x67766172);
      if (pTVar19 != (TT_Table)0x0) {
        uVar18 = uVar18 | 0x100;
      }
    }
    pTVar19 = tt_face_lookup_table(pTVar25,0x43464632);
    if (pTVar19 != (TT_Table)0x0) {
      uVar18 = uVar18 | 0x100;
    }
  }
  (pTVar25->root).face_flags = uVar18;
  if ((cVar26 == '\x01') && ((pTVar25->os2).version != 0xffff)) {
    uVar3 = (pTVar25->os2).fsSelection;
    uVar21 = (ulong)((uint)((uVar3 & 0x201) != 0) | uVar3 >> 4 & 2);
  }
  else {
    bVar2 = (byte)(pTVar25->header).Mac_Style;
    uVar21 = (ulong)(byte)((bVar2 & 2) >> 1 | bVar2 * '\x02') & 3;
  }
  pFVar1 = &(pTVar25->root).style_flags;
  *pFVar1 = *pFVar1 | uVar21;
  tt_face_build_cmaps(pTVar25);
  uVar17 = (pTVar25->root).num_charmaps;
  uVar18 = 0;
  uVar21 = (ulong)uVar17;
  if ((int)uVar17 < 1) {
    uVar21 = uVar18;
  }
  bVar32 = false;
  do {
    if (uVar18 == uVar21) {
      if (!bVar32) {
        cmaprec.encoding = FT_ENCODING_UNICODE;
        cmaprec.platform_id = 3;
        cmaprec.encoding_id = 1;
        cmaprec.face = &pTVar25->root;
        local_98 = FT_CMap_New(&tt_cmap_unicode_class_rec.clazz,(FT_Pointer)0x0,&cmaprec,
                               (FT_CMap_conflict *)0x0);
        bVar32 = local_98 != 0;
        bVar33 = (local_98 & 0xff) != 0xa3;
        if (!bVar33) {
          local_98 = 0;
        }
        if (bVar32 && bVar33) {
          return local_98;
        }
      }
      uVar21 = (ulong)pTVar25->sbit_num_strikes;
      if (uVar21 != 0) {
        memory = ((pTVar25->root).stream)->memory;
        uVar3 = (pTVar25->header).Units_Per_EM;
        uVar17 = (uint)uVar3;
        if ((uVar3 == 0) || ((pTVar25->os2).version == 0xffff)) {
          uVar17 = 1;
          local_94 = CONCAT22(local_94._2_2_,1);
        }
        else {
          local_94 = CONCAT22(local_94._2_2_,(pTVar25->os2).xAvgCharWidth);
        }
        pFVar22 = (FT_Bitmap_Size *)
                  ft_mem_realloc(memory,0x20,0,uVar21,(void *)0x0,(FT_Error *)&local_98);
        (pTVar25->root).available_sizes = pFVar22;
        if (local_98 != 0) {
          return local_98;
        }
        local_78 = ft_mem_realloc(memory,4,0,uVar21,(void *)0x0,(FT_Error *)&local_98);
        if (local_98 != 0) {
          return local_98;
        }
        local_94 = (uint)(short)local_94;
        uVar18 = 0;
        local_84 = uVar17;
        local_70 = memory;
        for (uVar28 = 0; iVar16 = (int)uVar18, uVar21 != uVar28; uVar28 = uVar28 + 1) {
          pFVar22 = (local_90->root).available_sizes;
          local_98 = (**(code **)((long)local_80 + 0xd8))(local_90,uVar28,&cmaprec);
          uVar29 = uVar18;
          if (local_98 == 0) {
            pFVar22[uVar18].height = (FT_Short)(local_40 >> 6);
            pFVar22[uVar18].width =
                 (FT_Short)((int)((ushort)cmaprec.face * local_94 + (uVar17 >> 1)) / (int)local_84);
            pFVar22[uVar18].x_ppem = ((ulong)cmaprec.face & 0xffff) << 6;
            pFVar22[uVar18].y_ppem = (ulong)cmaprec.face._2_2_ << 6;
            pFVar22[uVar18].size = (ulong)cmaprec.face._2_2_ << 6;
            if (cmaprec.face._2_2_ != 0 && (ushort)cmaprec.face != 0) {
              uVar29 = (ulong)(iVar16 + 1);
              *(int *)((long)local_78 + uVar18 * 4) = (int)uVar28;
            }
          }
          uVar18 = uVar29;
        }
        pFVar23 = (FT_UInt *)ft_mem_realloc(local_70,4,uVar21,uVar18,local_78,(FT_Error *)&local_98)
        ;
        pTVar25 = local_90;
        if (iVar16 != 0) {
          local_90->sbit_strike_map = pFVar23;
          pFVar1 = &(local_90->root).face_flags;
          *(byte *)pFVar1 = (byte)*pFVar1 | 2;
          (local_90->root).num_fixed_sizes = iVar16;
        }
      }
      uVar21 = (pTVar25->root).face_flags;
      if ((uVar21 & 3) == 0) {
        uVar21 = uVar21 | 1;
        (pTVar25->root).face_flags = uVar21;
      }
      if ((uVar21 & 1) != 0) {
        uVar21._0_2_ = (local_90->header).xMin;
        uVar21._2_2_ = (local_90->header).yMin;
        uVar21._4_2_ = (local_90->header).xMax;
        uVar21._6_2_ = (local_90->header).yMax;
        auVar35._8_4_ = 0;
        auVar35._0_8_ = uVar21;
        auVar35._12_2_ = uVar21._6_2_;
        auVar35._14_2_ = uVar21._6_2_;
        auVar34._12_4_ = auVar35._12_4_;
        auVar34._8_2_ = 0;
        auVar34._0_8_ = uVar21;
        auVar34._10_2_ = uVar21._4_2_;
        auVar36._10_6_ = auVar34._10_6_;
        auVar36._8_2_ = uVar21._4_2_;
        auVar36._0_8_ = uVar21;
        auVar13._4_8_ = auVar36._8_8_;
        auVar13._2_2_ = uVar21._2_2_;
        auVar13._0_2_ = uVar21._2_2_;
        (local_90->root).bbox.xMin =
             CONCAT44(-(uint)((short)(undefined2)uVar21 < 0),(int)(short)(undefined2)uVar21);
        *(int *)&(local_90->root).bbox.xMax = auVar13._0_4_ >> 0x10;
        *(uint *)((long)&(local_90->root).bbox.xMax + 4) = -(uint)(auVar13._0_4_ < 0);
        uVar17._0_2_ = (local_90->header).xMax;
        uVar17._2_2_ = (local_90->header).yMax;
        auVar36 = pshuflw(ZEXT416(uVar17),ZEXT416(uVar17),0x60);
        iVar16 = auVar36._4_4_ >> 0x10;
        (local_90->root).bbox.xMax = CONCAT44(-(uint)(auVar36._0_4_ < 0),auVar36._0_4_ >> 0x10);
        (local_90->root).units_per_EM = (short)iVar16;
        (local_90->root).ascender = (short)((uint)iVar16 >> 0x10);
        *(uint *)&(local_90->root).descender = -(uint)(auVar36._4_4_ < 0);
        (local_90->root).units_per_EM = (local_90->header).Units_Per_EM;
        uVar7 = (local_90->horizontal).Ascender;
        (local_90->root).ascender = uVar7;
        sVar4 = (local_90->horizontal).Descender;
        (local_90->root).descender = sVar4;
        (local_90->root).height = (uVar7 - sVar4) + (local_90->horizontal).Line_Gap;
        if ((sVar4 == 0 && uVar7 == 0) && ((local_90->os2).version != 0xffff)) {
          sVar4 = (local_90->os2).sTypoAscender;
          sVar5 = (local_90->os2).sTypoDescender;
          if (sVar4 == 0 && sVar5 == 0) {
            uVar8 = (local_90->os2).usWinAscent;
            (local_90->root).ascender = uVar8;
            FVar6 = (local_90->os2).usWinDescent;
            (local_90->root).descender = -FVar6;
            FVar14 = FVar6 + uVar8;
          }
          else {
            (local_90->root).ascender = sVar4;
            (local_90->root).descender = sVar5;
            FVar14 = (sVar4 - sVar5) + (local_90->os2).sTypoLineGap;
          }
          (local_90->root).height = FVar14;
        }
        sVar4 = (local_90->postscript).underlineThickness;
        (local_90->root).max_advance_width = (local_90->horizontal).advance_Width_Max;
        pFVar24 = &(local_90->vertical).advance_Height_Max;
        if (local_90->vertical_info == '\0') {
          pFVar24 = (FT_UShort *)&(local_90->root).height;
        }
        (local_90->root).max_advance_height = *pFVar24;
        (local_90->root).underline_position = sVar4 / -2 + (local_90->postscript).underlinePosition;
        (local_90->root).underline_thickness = sVar4;
      }
      return local_98;
    }
    pFVar12 = (pTVar25->root).charmaps[uVar18];
    for (uVar28 = 0; uVar28 < 0x84; uVar28 = uVar28 + 0xc) {
      if ((*(uint *)((long)&sfnt_find_encoding_tt_encodings + uVar28) == (uint)pFVar12->platform_id)
         && ((*(uint *)((long)&DAT_00196e84 + uVar28) == (uint)pFVar12->encoding_id ||
             (*(uint *)((long)&DAT_00196e84 + uVar28) == 0xffffffff)))) {
        FVar9 = *(FT_Encoding *)((long)&DAT_00196e88 + uVar28);
        pFVar12->encoding = FVar9;
        if ((FVar9 == FT_ENCODING_UNICODE) || (FVar9 == FT_ENCODING_MS_SYMBOL)) {
          bVar32 = true;
        }
        goto LAB_0015a789;
      }
    }
    pFVar12->encoding = FT_ENCODING_NONE;
LAB_0015a789:
    uVar18 = uVar18 + 1;
  } while( true );
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  sfnt_load_face( FT_Stream      stream,
                  TT_Face        face,
                  FT_Int         face_instance_index,
                  FT_Int         num_params,
                  FT_Parameter*  params )
  {
    FT_Error      error;
#ifdef TT_CONFIG_OPTION_POSTSCRIPT_NAMES
    FT_Error      psnames_error;
#endif
    FT_Bool       has_outline;
    FT_Bool       is_apple_sbit;
    FT_Bool       is_apple_sbix;
    FT_Bool       ignore_typographic_family    = FALSE;
    FT_Bool       ignore_typographic_subfamily = FALSE;

    SFNT_Service  sfnt = (SFNT_Service)face->sfnt;

    FT_UNUSED( face_instance_index );


    /* Check parameters */

    {
      FT_Int  i;


      for ( i = 0; i < num_params; i++ )
      {
        if ( params[i].tag == FT_PARAM_TAG_IGNORE_TYPOGRAPHIC_FAMILY )
          ignore_typographic_family = TRUE;
        else if ( params[i].tag == FT_PARAM_TAG_IGNORE_TYPOGRAPHIC_SUBFAMILY )
          ignore_typographic_subfamily = TRUE;
      }
    }

    /* Load tables */

    /* We now support two SFNT-based bitmapped font formats.  They */
    /* are recognized easily as they do not include a `glyf'       */
    /* table.                                                      */
    /*                                                             */
    /* The first format comes from Apple, and uses a table named   */
    /* `bhed' instead of `head' to store the font header (using    */
    /* the same format).  It also doesn't include horizontal and   */
    /* vertical metrics tables (i.e. `hhea' and `vhea' tables are  */
    /* missing).                                                   */
    /*                                                             */
    /* The other format comes from Microsoft, and is used with     */
    /* WinCE/PocketPC.  It looks like a standard TTF, except that  */
    /* it doesn't contain outlines.                                */
    /*                                                             */

    FT_TRACE2(( "sfnt_load_face: %08p\n\n", face ));

    /* do we have outlines in there? */
#ifdef FT_CONFIG_OPTION_INCREMENTAL
    has_outline = FT_BOOL( face->root.internal->incremental_interface ||
                           tt_face_lookup_table( face, TTAG_glyf )    ||
                           tt_face_lookup_table( face, TTAG_CFF )     ||
                           tt_face_lookup_table( face, TTAG_CFF2 )    );
#else
    has_outline = FT_BOOL( tt_face_lookup_table( face, TTAG_glyf ) ||
                           tt_face_lookup_table( face, TTAG_CFF )  ||
                           tt_face_lookup_table( face, TTAG_CFF2 ) );
#endif

    is_apple_sbit = 0;
    is_apple_sbix = !face->goto_table( face, TTAG_sbix, stream, 0 );

    /* Apple 'sbix' color bitmaps are rendered scaled and then the 'glyf'
     * outline rendered on top.  We don't support that yet, so just ignore
     * the 'glyf' outline and advertise it as a bitmap-only font. */
    if ( is_apple_sbix )
      has_outline = FALSE;

    /* if this font doesn't contain outlines, we try to load */
    /* a `bhed' table                                        */
    if ( !has_outline && sfnt->load_bhed )
    {
      LOAD_( bhed );
      is_apple_sbit = FT_BOOL( !error );
    }

    /* load the font header (`head' table) if this isn't an Apple */
    /* sbit font file                                             */
    if ( !is_apple_sbit || is_apple_sbix )
    {
      LOAD_( head );
      if ( error )
        goto Exit;
    }

    /* OpenType 1.8.2 introduced limits to this value;    */
    /* however, they make sense for older SFNT fonts also */
    if ( face->header.Units_Per_EM <    16 ||
         face->header.Units_Per_EM > 16384 )
    {
      error = FT_THROW( Invalid_Table );

      goto Exit;
    }

    /* the following tables are often not present in embedded TrueType */
    /* fonts within PDF documents, so don't check for them.            */
    LOAD_( maxp );
    LOAD_( cmap );

    /* the following tables are optional in PCL fonts -- */
    /* don't check for errors                            */
    LOAD_( name );
    LOAD_( post );

#ifdef TT_CONFIG_OPTION_POSTSCRIPT_NAMES
    psnames_error = error;
#endif

    /* do not load the metrics headers and tables if this is an Apple */
    /* sbit font file                                                 */
    if ( !is_apple_sbit )
    {
      /* load the `hhea' and `hmtx' tables */
      LOADM_( hhea, 0 );
      if ( !error )
      {
        LOADM_( hmtx, 0 );
        if ( FT_ERR_EQ( error, Table_Missing ) )
        {
          error = FT_THROW( Hmtx_Table_Missing );

#ifdef FT_CONFIG_OPTION_INCREMENTAL
          /* If this is an incrementally loaded font and there are */
          /* overriding metrics, tolerate a missing `hmtx' table.  */
          if ( face->root.internal->incremental_interface          &&
               face->root.internal->incremental_interface->funcs->
                 get_glyph_metrics                                 )
          {
            face->horizontal.number_Of_HMetrics = 0;
            error                               = FT_Err_Ok;
          }
#endif
        }
      }
      else if ( FT_ERR_EQ( error, Table_Missing ) )
      {
        /* No `hhea' table necessary for SFNT Mac fonts. */
        if ( face->format_tag == TTAG_true )
        {
          FT_TRACE2(( "This is an SFNT Mac font.\n" ));

          has_outline = 0;
          error       = FT_Err_Ok;
        }
        else
        {
          error = FT_THROW( Horiz_Header_Missing );

#ifdef FT_CONFIG_OPTION_INCREMENTAL
          /* If this is an incrementally loaded font and there are */
          /* overriding metrics, tolerate a missing `hhea' table.  */
          if ( face->root.internal->incremental_interface          &&
               face->root.internal->incremental_interface->funcs->
                 get_glyph_metrics                                 )
          {
            face->horizontal.number_Of_HMetrics = 0;
            error                               = FT_Err_Ok;
          }
#endif

        }
      }

      if ( error )
        goto Exit;

      /* try to load the `vhea' and `vmtx' tables */
      LOADM_( hhea, 1 );
      if ( !error )
      {
        LOADM_( hmtx, 1 );
        if ( !error )
          face->vertical_info = 1;
      }

      if ( error && FT_ERR_NEQ( error, Table_Missing ) )
        goto Exit;

      LOAD_( os2 );
      if ( error )
      {
        /* we treat the table as missing if there are any errors */
        face->os2.version = 0xFFFFU;
      }
    }

    /* the optional tables */

    /* embedded bitmap support */
    if ( sfnt->load_eblc )
      LOAD_( eblc );

    /* consider the pclt, kerning, and gasp tables as optional */
    LOAD_( pclt );
    LOAD_( gasp );
    LOAD_( kern );

    face->root.num_glyphs = face->max_profile.numGlyphs;

    /* Bit 8 of the `fsSelection' field in the `OS/2' table denotes  */
    /* a WWS-only font face.  `WWS' stands for `weight', width', and */
    /* `slope', a term used by Microsoft's Windows Presentation      */
    /* Foundation (WPF).  This flag has been introduced in version   */
    /* 1.5 of the OpenType specification (May 2008).                 */

    face->root.family_name = NULL;
    face->root.style_name  = NULL;
    if ( face->os2.version != 0xFFFFU && face->os2.fsSelection & 256 )
    {
      if ( !ignore_typographic_family )
        GET_NAME( TYPOGRAPHIC_FAMILY, &face->root.family_name );
      if ( !face->root.family_name )
        GET_NAME( FONT_FAMILY, &face->root.family_name );

      if ( !ignore_typographic_subfamily )
        GET_NAME( TYPOGRAPHIC_SUBFAMILY, &face->root.style_name );
      if ( !face->root.style_name )
        GET_NAME( FONT_SUBFAMILY, &face->root.style_name );
    }
    else
    {
      GET_NAME( WWS_FAMILY, &face->root.family_name );
      if ( !face->root.family_name && !ignore_typographic_family )
        GET_NAME( TYPOGRAPHIC_FAMILY, &face->root.family_name );
      if ( !face->root.family_name )
        GET_NAME( FONT_FAMILY, &face->root.family_name );

      GET_NAME( WWS_SUBFAMILY, &face->root.style_name );
      if ( !face->root.style_name && !ignore_typographic_subfamily )
        GET_NAME( TYPOGRAPHIC_SUBFAMILY, &face->root.style_name );
      if ( !face->root.style_name )
        GET_NAME( FONT_SUBFAMILY, &face->root.style_name );
    }

    /* now set up root fields */
    {
      FT_Face  root  = &face->root;
      FT_Long  flags = root->face_flags;


      /*********************************************************************/
      /*                                                                   */
      /* Compute face flags.                                               */
      /*                                                                   */
      if ( face->sbit_table_type == TT_SBIT_TABLE_TYPE_CBLC ||
           face->sbit_table_type == TT_SBIT_TABLE_TYPE_SBIX )
        flags |= FT_FACE_FLAG_COLOR;      /* color glyphs */

      if ( has_outline == TRUE )
        flags |= FT_FACE_FLAG_SCALABLE;   /* scalable outlines */

      /* The sfnt driver only supports bitmap fonts natively, thus we */
      /* don't set FT_FACE_FLAG_HINTER.                               */
      flags |= FT_FACE_FLAG_SFNT       |  /* SFNT file format  */
               FT_FACE_FLAG_HORIZONTAL;   /* horizontal data   */

#ifdef TT_CONFIG_OPTION_POSTSCRIPT_NAMES
      if ( !psnames_error                             &&
           face->postscript.FormatType != 0x00030000L )
        flags |= FT_FACE_FLAG_GLYPH_NAMES;
#endif

      /* fixed width font? */
      if ( face->postscript.isFixedPitch )
        flags |= FT_FACE_FLAG_FIXED_WIDTH;

      /* vertical information? */
      if ( face->vertical_info )
        flags |= FT_FACE_FLAG_VERTICAL;

      /* kerning available ? */
      if ( TT_FACE_HAS_KERNING( face ) )
        flags |= FT_FACE_FLAG_KERNING;

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
      /* Don't bother to load the tables unless somebody asks for them. */
      /* No need to do work which will (probably) not be used.          */
      if ( face->variation_support & TT_FACE_FLAG_VAR_FVAR )
      {
        if ( tt_face_lookup_table( face, TTAG_glyf ) != 0 &&
             tt_face_lookup_table( face, TTAG_gvar ) != 0 )
          flags |= FT_FACE_FLAG_MULTIPLE_MASTERS;
        if ( tt_face_lookup_table( face, TTAG_CFF2 ) != 0 )
          flags |= FT_FACE_FLAG_MULTIPLE_MASTERS;
      }
#endif

      root->face_flags = flags;

      /*********************************************************************/
      /*                                                                   */
      /* Compute style flags.                                              */
      /*                                                                   */

      flags = 0;
      if ( has_outline == TRUE && face->os2.version != 0xFFFFU )
      {
        /* We have an OS/2 table; use the `fsSelection' field.  Bit 9 */
        /* indicates an oblique font face.  This flag has been        */
        /* introduced in version 1.5 of the OpenType specification.   */

        if ( face->os2.fsSelection & 512 )       /* bit 9 */
          flags |= FT_STYLE_FLAG_ITALIC;
        else if ( face->os2.fsSelection & 1 )    /* bit 0 */
          flags |= FT_STYLE_FLAG_ITALIC;

        if ( face->os2.fsSelection & 32 )        /* bit 5 */
          flags |= FT_STYLE_FLAG_BOLD;
      }
      else
      {
        /* this is an old Mac font, use the header field */

        if ( face->header.Mac_Style & 1 )
          flags |= FT_STYLE_FLAG_BOLD;

        if ( face->header.Mac_Style & 2 )
          flags |= FT_STYLE_FLAG_ITALIC;
      }

      root->style_flags |= flags;

      /*********************************************************************/
      /*                                                                   */
      /* Polish the charmaps.                                              */
      /*                                                                   */
      /*   Try to set the charmap encoding according to the platform &     */
      /*   encoding ID of each charmap.  Emulate Unicode charmap if one    */
      /*   is missing.                                                     */
      /*                                                                   */

      tt_face_build_cmaps( face );  /* ignore errors */


      /* set the encoding fields */
      {
        FT_Int   m;
#ifdef FT_CONFIG_OPTION_POSTSCRIPT_NAMES
        FT_Bool  has_unicode = FALSE;
#endif


        for ( m = 0; m < root->num_charmaps; m++ )
        {
          FT_CharMap  charmap = root->charmaps[m];


          charmap->encoding = sfnt_find_encoding( charmap->platform_id,
                                                  charmap->encoding_id );

#ifdef FT_CONFIG_OPTION_POSTSCRIPT_NAMES

          if ( charmap->encoding == FT_ENCODING_UNICODE   ||
               charmap->encoding == FT_ENCODING_MS_SYMBOL )  /* PUA */
            has_unicode = TRUE;
        }

        /* synthesize Unicode charmap if one is missing */
        if ( !has_unicode )
        {
          FT_CharMapRec cmaprec;


          cmaprec.face        = root;
          cmaprec.platform_id = TT_PLATFORM_MICROSOFT;
          cmaprec.encoding_id = TT_MS_ID_UNICODE_CS;
          cmaprec.encoding    = FT_ENCODING_UNICODE;


          error = FT_CMap_New( (FT_CMap_Class)&tt_cmap_unicode_class_rec,
                               NULL, &cmaprec, NULL );
          if ( error                                      &&
               FT_ERR_NEQ( error, No_Unicode_Glyph_Name ) )
            goto Exit;
          error = FT_Err_Ok;

#endif /* FT_CONFIG_OPTION_POSTSCRIPT_NAMES */

        }
      }

#ifdef TT_CONFIG_OPTION_EMBEDDED_BITMAPS

      /*
       *  Now allocate the root array of FT_Bitmap_Size records and
       *  populate them.  Unfortunately, it isn't possible to indicate bit
       *  depths in the FT_Bitmap_Size record.  This is a design error.
       */
      {
        FT_UInt  count;


        count = face->sbit_num_strikes;

        if ( count > 0 )
        {
          FT_Memory        memory   = face->root.stream->memory;
          FT_UShort        em_size  = face->header.Units_Per_EM;
          FT_Short         avgwidth = face->os2.xAvgCharWidth;
          FT_Size_Metrics  metrics;

          FT_UInt*  sbit_strike_map = NULL;
          FT_UInt   strike_idx, bsize_idx;


          if ( em_size == 0 || face->os2.version == 0xFFFFU )
          {
            avgwidth = 1;
            em_size = 1;
          }

          /* to avoid invalid strike data in the `available_sizes' field */
          /* of `FT_Face', we map `available_sizes' indices to strike    */
          /* indices                                                     */
          if ( FT_NEW_ARRAY( root->available_sizes, count ) ||
               FT_NEW_ARRAY( sbit_strike_map, count ) )
            goto Exit;

          bsize_idx = 0;
          for ( strike_idx = 0; strike_idx < count; strike_idx++ )
          {
            FT_Bitmap_Size*  bsize = root->available_sizes + bsize_idx;


            error = sfnt->load_strike_metrics( face, strike_idx, &metrics );
            if ( error )
              continue;

            bsize->height = (FT_Short)( metrics.height >> 6 );
            bsize->width  = (FT_Short)(
              ( avgwidth * metrics.x_ppem + em_size / 2 ) / em_size );

            bsize->x_ppem = metrics.x_ppem << 6;
            bsize->y_ppem = metrics.y_ppem << 6;

            /* assume 72dpi */
            bsize->size   = metrics.y_ppem << 6;

            /* only use strikes with valid PPEM values */
            if ( bsize->x_ppem && bsize->y_ppem )
              sbit_strike_map[bsize_idx++] = strike_idx;
          }

          /* reduce array size to the actually used elements */
          (void)FT_RENEW_ARRAY( sbit_strike_map, count, bsize_idx );

          /* from now on, all strike indices are mapped */
          /* using `sbit_strike_map'                    */
          if ( bsize_idx )
          {
            face->sbit_strike_map = sbit_strike_map;

            root->face_flags     |= FT_FACE_FLAG_FIXED_SIZES;
            root->num_fixed_sizes = (FT_Int)bsize_idx;
          }
        }
      }

#endif /* TT_CONFIG_OPTION_EMBEDDED_BITMAPS */

      /* a font with no bitmaps and no outlines is scalable; */
      /* it has only empty glyphs then                       */
      if ( !FT_HAS_FIXED_SIZES( root ) && !FT_IS_SCALABLE( root ) )
        root->face_flags |= FT_FACE_FLAG_SCALABLE;


      /*********************************************************************/
      /*                                                                   */
      /*  Set up metrics.                                                  */
      /*                                                                   */
      if ( FT_IS_SCALABLE( root ) )
      {
        /* XXX What about if outline header is missing */
        /*     (e.g. sfnt wrapped bitmap)?             */
        root->bbox.xMin    = face->header.xMin;
        root->bbox.yMin    = face->header.yMin;
        root->bbox.xMax    = face->header.xMax;
        root->bbox.yMax    = face->header.yMax;
        root->units_per_EM = face->header.Units_Per_EM;


        /* XXX: Computing the ascender/descender/height is very different */
        /*      from what the specification tells you.  Apparently, we    */
        /*      must be careful because                                   */
        /*                                                                */
        /*      - not all fonts have an OS/2 table; in this case, we take */
        /*        the values in the horizontal header.  However, these    */
        /*        values very often are not reliable.                     */
        /*                                                                */
        /*      - otherwise, the correct typographic values are in the    */
        /*        sTypoAscender, sTypoDescender & sTypoLineGap fields.    */
        /*                                                                */
        /*        However, certain fonts have these fields set to 0.      */
        /*        Rather, they have usWinAscent & usWinDescent correctly  */
        /*        set (but with different values).                        */
        /*                                                                */
        /*      As an example, Arial Narrow is implemented through four   */
        /*      files ARIALN.TTF, ARIALNI.TTF, ARIALNB.TTF & ARIALNBI.TTF */
        /*                                                                */
        /*      Strangely, all fonts have the same values in their        */
        /*      sTypoXXX fields, except ARIALNB which sets them to 0.     */
        /*                                                                */
        /*      On the other hand, they all have different                */
        /*      usWinAscent/Descent values -- as a conclusion, the OS/2   */
        /*      table cannot be used to compute the text height reliably! */
        /*                                                                */

        /* The ascender and descender are taken from the `hhea' table. */
        /* If zero, they are taken from the `OS/2' table.              */

        root->ascender  = face->horizontal.Ascender;
        root->descender = face->horizontal.Descender;

        root->height = root->ascender - root->descender +
                       face->horizontal.Line_Gap;

        if ( !( root->ascender || root->descender ) )
        {
          if ( face->os2.version != 0xFFFFU )
          {
            if ( face->os2.sTypoAscender || face->os2.sTypoDescender )
            {
              root->ascender  = face->os2.sTypoAscender;
              root->descender = face->os2.sTypoDescender;

              root->height = root->ascender - root->descender +
                             face->os2.sTypoLineGap;
            }
            else
            {
              root->ascender  =  (FT_Short)face->os2.usWinAscent;
              root->descender = -(FT_Short)face->os2.usWinDescent;

              root->height = root->ascender - root->descender;
            }
          }
        }

        root->max_advance_width  =
          (FT_Short)face->horizontal.advance_Width_Max;
        root->max_advance_height =
          (FT_Short)( face->vertical_info ? face->vertical.advance_Height_Max
                                          : root->height );

        /* See https://www.microsoft.com/typography/otspec/post.htm -- */
        /* Adjust underline position from top edge to centre of        */
        /* stroke to convert TrueType meaning to FreeType meaning.     */
        root->underline_position  = face->postscript.underlinePosition -
                                    face->postscript.underlineThickness / 2;
        root->underline_thickness = face->postscript.underlineThickness;
      }

    }

  Exit:
    FT_TRACE2(( "sfnt_load_face: done\n" ));

    return error;
  }